

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_mgr.cxx
# Opt level: O1

bool nuraft::raft_server::get_stat_histogram
               (string *name,
               map<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
               *histogram_out)

{
  Histogram *pHVar1;
  stat_elem *psVar2;
  ulong uVar3;
  bool bVar4;
  size_t i;
  ulong uVar5;
  bool bVar6;
  pair<unsigned_long,_unsigned_long> local_38;
  
  stat_mgr::get_instance();
  psVar2 = stat_mgr::get_stat(&stat_mgr::get_instance::mgr_instance,name);
  if ((psVar2 == (stat_elem *)0x0) || (psVar2->stat_type_ != HISTOGRAM)) {
    bVar4 = false;
  }
  else {
    pHVar1 = psVar2->hist_;
    uVar5 = 0;
    do {
      if (pHVar1->bins[uVar5].super___atomic_base<unsigned_long>._M_i != 0) goto LAB_00159c3d;
      uVar5 = uVar5 + 1;
    } while (uVar5 != 0x41);
    uVar5 = 0x41;
LAB_00159c3d:
    bVar4 = true;
    if (uVar5 != 0x41) {
      do {
        local_38.second = pHVar1->bins[uVar5].super___atomic_base<unsigned_long>._M_i;
        if (local_38.second != 0) {
          local_38.first = -(ulong)(uVar5 == 0) | 1L << ((ulong)(byte)(0x40 - (char)uVar5) & 0x3f);
          std::
          _Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
          ::_M_emplace_unique<std::pair<unsigned_long,unsigned_long>>
                    ((_Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                      *)histogram_out,&local_38);
        }
        uVar3 = 0x40;
        if (uVar5 < 0x40) {
          uVar3 = uVar5;
        }
        bVar6 = uVar5 < 0x40;
        uVar5 = uVar3 + 1;
      } while (bVar6);
    }
  }
  return bVar4;
}

Assistant:

bool raft_server::get_stat_histogram(const std::string& name,
                                     std::map<double, uint64_t>& histogram_out ) {
    stat_elem* elem = stat_mgr::get_instance()->get_stat(name);
    if (!elem) return false;
    if (elem->get_type() != stat_elem::HISTOGRAM) return false;

    for (HistItr& entry: *elem->get_histogram()) {
        uint64_t cnt = entry.getCount();
        if (cnt) {
            histogram_out.insert( std::make_pair(entry.getUpperBound(), cnt) );
        }
    }
    return true;
}